

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

yy_state_type yy_get_previous_state(void)

{
  YY_CHAR yy_c;
  char *yy_cp;
  yy_state_type yy_current_state;
  
  yy_current_state = yy_start;
  for (yy_cp = yytext; yy_cp < yy_c_buf_p; yy_cp = yy_cp + 1) {
    if (*yy_cp == '\0') {
      yy_c = '\x01';
    }
    else {
      yy_c = ""[(byte)*yy_cp];
    }
    if (yy_accept[yy_current_state] != 0) {
      yy_last_accepting_state = yy_current_state;
      yy_last_accepting_cpos = yy_cp;
    }
    while (yy_chk[(int)((int)yy_base[yy_current_state] + (uint)yy_c)] != yy_current_state) {
      yy_current_state = (yy_state_type)yy_def[yy_current_state];
      if (0x3b < yy_current_state) {
        yy_c = ""[yy_c];
      }
    }
    yy_current_state = (yy_state_type)yy_nxt[(int)((int)yy_base[yy_current_state] + (uint)yy_c)];
  }
  return yy_current_state;
}

Assistant:

static yy_state_type yy_get_previous_state (void)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 60 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}